

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  uint *puVar1;
  byte bVar2;
  element_type *peVar3;
  type_error *ptVar4;
  long *plVar5;
  size_type *psVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  array<char,_512UL> *paVar8;
  byte bVar9;
  long lVar10;
  unsigned_long __val;
  uint uVar11;
  ulong unaff_R15;
  stringstream ss;
  undefined1 auStack_278 [11];
  byte local_26d;
  uint local_26c;
  array<char,_512UL> *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [50];
  char acStack_c8 [152];
  
  uVar7 = CONCAT71(in_register_00000011,ensure_ascii);
  if (s->_M_string_length != 0) {
    paVar8 = &this->string_buffer;
    local_26c = (uint)uVar7;
    local_26d = !ensure_ascii;
    lVar10 = 0;
    __val = 0;
    bVar9 = 0;
    local_268 = paVar8;
    local_240 = this;
    do {
      bVar2 = (s->_M_dataplus)._M_p[__val];
      if (bVar9 == 0) {
        uVar11 = 0xffU >> (serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                           ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d[bVar2] & 0x1f
                          ) & (uint)bVar2;
      }
      else {
        uVar11 = (int)unaff_R15 << 6 | bVar2 & 0x3f;
      }
      unaff_R15 = (ulong)uVar11;
      bVar9 = serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d
              [(ulong)(byte)serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                            ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d[bVar2] +
               (ulong)bVar9 * 0x10 + 0x100];
      if (bVar9 == 0) {
        switch(uVar11) {
        case 8:
          (paVar8->_M_elems + lVar10)[0] = '\\';
          (paVar8->_M_elems + lVar10)[1] = 'b';
          break;
        case 9:
          (paVar8->_M_elems + lVar10)[0] = '\\';
          (paVar8->_M_elems + lVar10)[1] = 't';
          break;
        case 10:
          (paVar8->_M_elems + lVar10)[0] = '\\';
          (paVar8->_M_elems + lVar10)[1] = 'n';
          break;
        case 0xb:
switchD_00154a50_caseD_b:
          if ((0x1f < uVar11 & (uVar11 < 0x7f | local_26d)) == 0) {
            if (uVar11 < 0x10000) {
              snprintf(paVar8->_M_elems + lVar10,7,"\\u%04x",unaff_R15);
              lVar10 = lVar10 + 6;
            }
            else {
              snprintf(paVar8->_M_elems + lVar10,0xd,"\\u%04x\\u%04x",
                       (ulong)((uVar11 >> 10) + 0xd7c0 & 0xffff),(ulong)(uVar11 & 0x3ff | 0xdc00));
              lVar10 = lVar10 + 0xc;
            }
            uVar7 = (ulong)local_26c;
            paVar8 = local_268;
          }
          else {
            paVar8->_M_elems[lVar10] = bVar2;
            lVar10 = lVar10 + 1;
          }
          goto LAB_00154aec;
        case 0xc:
          (paVar8->_M_elems + lVar10)[0] = '\\';
          (paVar8->_M_elems + lVar10)[1] = 'f';
          break;
        case 0xd:
          (paVar8->_M_elems + lVar10)[0] = '\\';
          (paVar8->_M_elems + lVar10)[1] = 'r';
          break;
        default:
          if (uVar11 == 0x22) {
            (paVar8->_M_elems + lVar10)[0] = '\\';
            (paVar8->_M_elems + lVar10)[1] = '\"';
          }
          else {
            if (uVar11 != 0x5c) goto switchD_00154a50_caseD_b;
            (paVar8->_M_elems + lVar10)[0] = '\\';
            (paVar8->_M_elems + lVar10)[1] = '\\';
          }
        }
        lVar10 = lVar10 + 2;
LAB_00154aec:
        if (lVar10 - 500U < 0xd) {
          peVar3 = (local_240->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar3->_vptr_output_adapter_protocol[1])(peVar3,local_268,lVar10);
          uVar7 = (ulong)local_26c;
          lVar10 = 0;
          paVar8 = local_268;
        }
      }
      else {
        if (bVar9 == 1) {
          std::__cxx11::stringstream::stringstream(local_1b8);
          *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
          puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
          *puVar1 = *puVar1 | 0x4000;
          lVar10 = *(long *)(local_1a8[0] + -0x18);
          if (acStack_c8[lVar10 + 1] == '\0') {
            std::ios::widen((char)auStack_278 + (char)lVar10 + -0x30);
            acStack_c8[lVar10 + 1] = '\x01';
          }
          acStack_c8[lVar10] = '0';
          *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
               *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
          std::ostream::operator<<(local_1a8,(uint)bVar2);
          ptVar4 = (type_error *)__cxa_allocate_exception(0x20);
          Catch::clara::std::__cxx11::to_string(&local_218,__val);
          std::operator+(&local_1d8,"invalid UTF-8 byte at index ",&local_218);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d8);
          local_260._M_dataplus._M_p = (pointer)*plVar5;
          psVar6 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_260._M_dataplus._M_p == psVar6) {
            local_260.field_2._M_allocated_capacity = *psVar6;
            local_260.field_2._8_8_ = plVar5[3];
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          }
          else {
            local_260.field_2._M_allocated_capacity = *psVar6;
          }
          local_260._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::stringbuf::str();
          std::operator+(&local_238,&local_260,&local_1f8);
          type_error::create(ptVar4,0x13c,&local_238);
          __cxa_throw(ptVar4,&type_error::typeinfo,exception::~exception);
        }
        if ((char)uVar7 == '\0') {
          paVar8->_M_elems[lVar10] = bVar2;
          lVar10 = lVar10 + 1;
        }
      }
      __val = __val + 1;
    } while (__val < s->_M_string_length);
    if (bVar9 != 0) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
      puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
      *puVar1 = *puVar1 | 0x4000;
      lVar10 = *(long *)(local_1a8[0] + -0x18);
      if (acStack_c8[lVar10 + 1] == '\0') {
        std::ios::widen((char)auStack_278 + (char)lVar10 + -0x30);
        acStack_c8[lVar10 + 1] = '\x01';
      }
      acStack_c8[lVar10] = '0';
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<(local_1a8,(uint)(byte)(s->_M_dataplus)._M_p[s->_M_string_length - 1])
      ;
      ptVar4 = (type_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      std::operator+(&local_238,"incomplete UTF-8 string; last byte: 0x",&local_260);
      type_error::create(ptVar4,0x13c,&local_238);
      __cxa_throw(ptVar4,&type_error::typeinfo,exception::~exception);
    }
    if (lVar10 != 0) {
      peVar3 = (local_240->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar3->_vptr_output_adapter_protocol[1])(peVar3,paVar8,lVar10);
      return;
    }
  }
  return;
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
{
uint32_t codepoint;
uint8_t state = UTF8_ACCEPT;
std::size_t bytes = 0;  // number of bytes written to string_buffer

for (std::size_t i = 0; i < s.size(); ++i)
{
const auto byte = static_cast<uint8_t>(s[i]);

switch (decode(state, codepoint, byte))
{
case UTF8_ACCEPT:  // decode found a new code point
{
switch (codepoint)
{
case 0x08: // backspace
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 'b';
break;
}

case 0x09: // horizontal tab
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 't';
break;
}

case 0x0A: // newline
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 'n';
break;
}

case 0x0C: // formfeed
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 'f';
break;
}

case 0x0D: // carriage return
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 'r';
break;
}

case 0x22: // quotation mark
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = '\"';
break;
}

case 0x5C: // reverse solidus
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = '\\';
break;
}

default:
{
// escape control characters (0x00..0x1F) or, if
// ensure_ascii parameter is used, non-ASCII characters
if ((codepoint <= 0x1F) or (ensure_ascii and (codepoint >= 0x7F)))
{
if (codepoint <= 0xFFFF)
{
std::snprintf(string_buffer.data() + bytes, 7, "\\u%04x",
static_cast<uint16_t>(codepoint));
bytes += 6;
}
else
{
std::snprintf(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
static_cast<uint16_t>(0xD7C0 + (codepoint >> 10)),
static_cast<uint16_t>(0xDC00 + (codepoint & 0x3FF)));
bytes += 12;
}
}
else
{
// copy byte to buffer (all previous bytes
// been copied have in default case above)
string_buffer[bytes++] = s[i];
}
break;
}
}

// write buffer and reset index; there must be 13 bytes
// left, as this is the maximal number of bytes to be
// written ("\uxxxx\uxxxx\0") for one code point
if (string_buffer.size() - bytes < 13)
{
o->write_characters(string_buffer.data(), bytes);
bytes = 0;
}
break;
}

case UTF8_REJECT:  // decode found invalid UTF-8 byte
{
std::stringstream ss;
ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(byte);
JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + ss.str()));
}

default:  // decode found yet incomplete multi-byte code point
{
if (not ensure_ascii)
{
// code point will not be escaped - copy byte to buffer
string_buffer[bytes++] = s[i];
}
break;
}
}
}

if (JSON_LIKELY(state == UTF8_ACCEPT))
{
// write buffer
if (bytes > 0)
{
o->write_characters(string_buffer.data(), bytes);
}
}
else
{
// we finish reading, but do not accept: string was incomplete
std::stringstream ss;
ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(static_cast<uint8_t>(s.back()));
JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + ss.str()));
}
}